

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Xdl.cpp
# Opt level: O0

void __thiscall asl::XdlParser::end_object(XdlParser *this)

{
  Var *v_00;
  undefined1 local_20 [8];
  Var v;
  XdlParser *this_local;
  
  v.field_1 = (anon_union_8_8_7df20137_for_Var_3)this;
  v_00 = Stack<asl::Var>::top(&this->_lists);
  Var::Var((Var *)local_20,v_00);
  Stack<asl::Var>::pop(&this->_lists);
  put(this,(Var *)local_20);
  Var::~Var((Var *)local_20);
  return;
}

Assistant:

void XdlParser::end_object()
{
	Var v = _lists.top();
	_lists.pop();
	put(v);
}